

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::XThreadEvent::done(XThreadEvent *this)

{
  bool bVar1;
  EventLoop *this_00;
  Executor *pEVar2;
  Impl *pIVar3;
  State *pSVar4;
  Type local_8c;
  Fault local_88;
  Fault f_1;
  undefined1 local_78 [8];
  Locked<kj::Executor::Impl::State> lock;
  Fault local_58;
  Fault f;
  Executor *local_48;
  Maybe<kj::_::XThreadEvent_&> local_40;
  undefined1 local_38 [8];
  DebugComparison<const_kj::Executor_*,_const_kj::Executor_*> _kjCondition;
  XThreadEvent *this_local;
  
  _kjCondition._32_8_ = this;
  local_48 = Own<const_kj::Executor,_std::nullptr_t>::get(&this->targetExecutor);
  local_40.ptr = (XThreadEvent *)
                 DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_48);
  this_00 = anon_unknown_173::currentEventLoop();
  f.exception = (Exception *)EventLoop::getExecutor(this_00);
  DebugExpression<kj::Executor_const*>::operator==
            ((DebugComparison<const_kj::Executor_*,_const_kj::Executor_*> *)local_38,
             (DebugExpression<kj::Executor_const*> *)&local_40,(Executor **)&f);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_38);
  if (!bVar1) {
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Executor_const*,kj::Executor_const*>&,char_const(&)[34]>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x439,FAILED,"targetExecutor.get() == &currentEventLoop().getExecutor()",
               "_kjCondition,\"calling done() from wrong thread?\"",
               (DebugComparison<const_kj::Executor_*,_const_kj::Executor_*> *)local_38,
               (char (*) [34])"calling done() from wrong thread?");
    Debug::Fault::fatal(&local_58);
  }
  sendReply(this);
  pEVar2 = Own<const_kj::Executor,_std::nullptr_t>::operator->(&this->targetExecutor);
  pIVar3 = Own<kj::Executor::Impl,_std::nullptr_t>::operator->(&pEVar2->impl);
  MutexGuarded<kj::Executor::Impl::State>::lockExclusive
            ((MutexGuarded<kj::Executor::Impl::State> *)local_78,pIVar3);
  if (this->state == EXECUTING) {
    pSVar4 = Locked<kj::Executor::Impl::State>::operator->
                       ((Locked<kj::Executor::Impl::State> *)local_78);
    List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::remove
              (&pSVar4->executing,(char *)this);
  }
  else {
    if (this->state != CANCELING) {
      local_8c = this->state;
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34],unsigned_int>
                (&local_88,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                 ,0x44a,FAILED,(char *)0x0,"\"can\'t call done() from this state\", (uint)state",
                 (char (*) [34])"can\'t call done() from this state",&local_8c);
      Debug::Fault::fatal(&local_88);
    }
    pSVar4 = Locked<kj::Executor::Impl::State>::operator->
                       ((Locked<kj::Executor::Impl::State> *)local_78);
    List<kj::_::XThreadEvent,_&kj::_::XThreadEvent::targetLink>::remove
              (&pSVar4->cancel,(char *)this);
  }
  setDoneState(this);
  Locked<kj::Executor::Impl::State>::~Locked((Locked<kj::Executor::Impl::State> *)local_78);
  return;
}

Assistant:

void XThreadEvent::done() {
  KJ_ASSERT(targetExecutor.get() == &currentEventLoop().getExecutor(),
      "calling done() from wrong thread?");

  sendReply();

  {
    auto lock = targetExecutor->impl->state.lockExclusive();

    switch (state) {
      case EXECUTING:
        lock->executing.remove(*this);
        break;
      case CANCELING:
        // Sending thread requested cancellation, but we're done anyway, so it doesn't matter at this
        // point.
        lock->cancel.remove(*this);
        break;
      default:
        KJ_FAIL_ASSERT("can't call done() from this state", (uint)state);
    }

    setDoneState();
  }
}